

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_set.c
# Opt level: O1

ngram_model_t * ngram_model_set_select(ngram_model_t *base,char *name)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ngram_model_t *pnVar4;
  ulong uVar5;
  
  uVar1 = base[1].refcount;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  else {
    lVar2 = *(long *)&base[1].n_1g_alloc;
    uVar5 = 0;
    do {
      iVar3 = strcmp(*(char **)(lVar2 + uVar5 * 8),name);
      if (iVar3 == 0) goto LAB_00131450;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    uVar5 = (ulong)uVar1;
  }
LAB_00131450:
  if ((uint)uVar5 == uVar1) {
    pnVar4 = (ngram_model_t *)0x0;
  }
  else {
    *(uint *)&base[1].field_0x4 = (uint)uVar5;
    pnVar4 = *(ngram_model_t **)(base[1].n_counts + (uVar5 & 0xffffffff) * 2);
  }
  return pnVar4;
}

Assistant:

ngram_model_t *
ngram_model_set_select(ngram_model_t * base, const char *name)
{
    ngram_model_set_t *set = (ngram_model_set_t *) base;
    int32 i;

    /* There probably won't be very many submodels. */
    for (i = 0; i < set->n_models; ++i)
        if (0 == strcmp(set->names[i], name))
            break;
    if (i == set->n_models)
        return NULL;
    set->cur = i;
    return set->lms[set->cur];
}